

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O2

path * __thiscall ArgsManager::GetBlocksDirPath(path *__return_storage_ptr__,ArgsManager *this)

{
  path *this_00;
  bool bVar1;
  CBaseChainParams *pCVar2;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock7;
  string in_stack_ffffffffffffff18;
  path local_c8;
  undefined1 local_a0 [32];
  path local_80;
  path local_58;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&stack0xffffffffffffff28,
             &this->cs_args,"cs_args",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/common/args.cpp"
             ,0x11c,false);
  this_00 = &this->m_cached_blocks_path;
  if ((this->m_cached_blocks_path).super_path._M_pathname._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"-blocksdir",(allocator<char> *)(local_a0 + 0x20));
    bVar1 = IsArgSet(this,&local_58._M_pathname);
    std::__cxx11::string::~string((string *)&local_58);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_a0,"-blocksdir",(allocator<char> *)&stack0xffffffffffffff27);
      local_c8._M_pathname.field_2._M_allocated_capacity = 0;
      local_c8._M_pathname.field_2._8_8_ = 0;
      local_c8._M_pathname._M_dataplus._M_p = (pointer)0x0;
      local_c8._M_pathname._M_string_length = 0;
      local_c8._M_cmpts._M_impl._M_t.
      super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      ._M_t.
      super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
           (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
            )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
              )0x0;
      std::filesystem::__cxx11::path::path(&local_c8);
      GetPathArg((path *)(local_a0 + 0x20),this,in_stack_ffffffffffffff18,(path *)local_a0);
      fs::absolute((path *)&local_58,(path *)(local_a0 + 0x20));
      std::filesystem::__cxx11::path::operator=(&this_00->super_path,&local_58);
      std::filesystem::__cxx11::path::~path(&local_58);
      std::filesystem::__cxx11::path::~path((path *)(local_a0 + 0x20));
      std::filesystem::__cxx11::path::~path(&local_c8);
      std::__cxx11::string::~string((string *)local_a0);
      bVar1 = std::filesystem::is_directory(&this_00->super_path);
      if (!bVar1) {
        fs::path::operator=(this_00,"");
        goto LAB_00a58706;
      }
    }
    else {
      GetDataDirBase((path *)&local_58,this);
      std::filesystem::__cxx11::path::operator=(&this_00->super_path,&local_58);
      std::filesystem::__cxx11::path::~path(&local_58);
    }
    pCVar2 = BaseParams();
    fs::PathFromString((path *)&local_58,&pCVar2->strDataDir);
    std::filesystem::__cxx11::path::operator/=(&this_00->super_path,(path *)&local_58);
    std::filesystem::__cxx11::path::~path(&local_58);
    fs::path::operator/=(this_00,"blocks");
    bVar1 = std::filesystem::is_symlink(&this_00->super_path);
    if (bVar1) {
      bVar1 = std::filesystem::is_directory(&this_00->super_path);
      if (bVar1) goto LAB_00a58706;
    }
    std::filesystem::create_directories((path *)this_00);
  }
LAB_00a58706:
  std::filesystem::__cxx11::path::path(&__return_storage_ptr__->super_path,&this_00->super_path);
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&stack0xffffffffffffff28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

fs::path ArgsManager::GetBlocksDirPath() const
{
    LOCK(cs_args);
    fs::path& path = m_cached_blocks_path;

    // Cache the path to avoid calling fs::create_directories on every call of
    // this function
    if (!path.empty()) return path;

    if (IsArgSet("-blocksdir")) {
        path = fs::absolute(GetPathArg("-blocksdir"));
        if (!fs::is_directory(path)) {
            path = "";
            return path;
        }
    } else {
        path = GetDataDirBase();
    }

    path /= fs::PathFromString(BaseParams().DataDir());
    path /= "blocks";
    fs::create_directories(path);
    return path;
}